

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O2

int __thiscall YAML::RegEx::MatchOpAnd<YAML::StreamCharSource>(RegEx *this,StreamCharSource *source)

{
  pointer pRVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  lVar4 = 0;
  iVar3 = -1;
  uVar5 = 0;
  while( true ) {
    pRVar1 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 5) <= uVar5) {
      return iVar3;
    }
    iVar2 = MatchUnchecked<YAML::StreamCharSource>((RegEx *)((long)&pRVar1->m_op + lVar4),source);
    if (iVar2 == -1) break;
    if (uVar5 == 0) {
      iVar3 = iVar2;
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x20;
  }
  return -1;
}

Assistant:

inline int RegEx::MatchOpAnd(const Source& source) const {
  int first = -1;
  for (std::size_t i = 0; i < m_params.size(); i++) {
    int n = m_params[i].MatchUnchecked(source);
    if (n == -1)
      return -1;
    if (i == 0)
      first = n;
  }
  return first;
}